

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O1

bool __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::get_entry
          (dynamic_section_accessor_template<ELFIO::section> *this,Elf_Xword index,Elf_Xword *tag,
          Elf_Xword *value,string *str)

{
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var1;
  elfio *peVar2;
  pointer puVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Elf_Xword EVar8;
  char *__s;
  string_section_accessor strsec;
  __uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_> local_30;
  
  EVar8 = get_entries_num(this);
  if (index < EVar8) {
    _Var1._M_head_impl =
         (this->elf_file->header)._M_t.
         super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
         super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
         super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if ((_Var1._M_head_impl == (elf_header *)0x0) ||
       (iVar6 = (*(_Var1._M_head_impl)->_vptr_elf_header[4])(), (char)iVar6 != '\x01')) {
      generic_get_entry_dyn<ELFIO::Elf64_Dyn>(this,index,tag,value);
    }
    else {
      generic_get_entry_dyn<ELFIO::Elf32_Dyn>(this,index,tag,value);
    }
    if ((*tag < 0x1e) && ((0x2000c002UL >> (*tag & 0x3f) & 1) != 0)) {
      peVar2 = this->elf_file;
      uVar7 = (*this->dynamic_section->_vptr_section[0xb])();
      peVar2 = (peVar2->sections).parent;
      puVar3 = (peVar2->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(uVar7 & 0xffff) <
          (ulong)((long)(peVar2->sections_).
                        super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
        local_30._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
        .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
             *(tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_> *)
              &puVar3[uVar7 & 0xffff]._M_t;
      }
      else {
        local_30._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
        .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
             (tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_>)
             (_Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>)0x0;
      }
      __s = string_section_accessor_template<ELFIO::section>::get_string
                      ((string_section_accessor_template<ELFIO::section> *)&local_30,
                       (Elf_Word)*value);
      if (__s == (char *)0x0) {
        str->_M_string_length = 0;
        *(str->_M_dataplus)._M_p = '\0';
        goto LAB_001167e3;
      }
      pcVar4 = (char *)str->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)str,0,pcVar4,(ulong)__s);
    }
    else {
      str->_M_string_length = 0;
      *(str->_M_dataplus)._M_p = '\0';
    }
    bVar5 = true;
  }
  else {
LAB_001167e3:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool get_entry( Elf_Xword    index,
                    Elf_Xword&   tag,
                    Elf_Xword&   value,
                    std::string& str ) const
    {
        if ( index >= get_entries_num() ) { // Is index valid
            return false;
        }

        if ( elf_file.get_class() == ELFCLASS32 ) {
            generic_get_entry_dyn<Elf32_Dyn>( index, tag, value );
        }
        else {
            generic_get_entry_dyn<Elf64_Dyn>( index, tag, value );
        }

        // If the tag has a string table reference - prepare the string
        if ( tag == DT_NEEDED || tag == DT_SONAME || tag == DT_RPATH ||
             tag == DT_RUNPATH ) {
            string_section_accessor strsec(
                elf_file.sections[get_string_table_index()] );
            const char* result = strsec.get_string( (Elf_Word)value );
            if ( nullptr == result ) {
                str.clear();
                return false;
            }
            str = result;
        }
        else {
            str.clear();
        }

        return true;
    }